

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

void __thiscall QGraphicsLinearLayout::invalidate(QGraphicsLinearLayout *this)

{
  bool bVar1;
  QGraphicsLinearLayoutPrivate *pQVar2;
  QGraphicsLayoutStyleInfo *pQVar3;
  QGraphicsLinearLayoutPrivate *d;
  QGraphicsLayout *in_stack_00000020;
  
  pQVar2 = d_func((QGraphicsLinearLayout *)0x9b7ddb);
  QGridLayoutEngine::invalidate();
  bVar1 = QScopedPointer::operator_cast_to_bool
                    ((QScopedPointer<QGraphicsLayoutStyleInfo,_QScopedPointerDeleter<QGraphicsLayoutStyleInfo>_>
                      *)0x9b7e02);
  if (bVar1) {
    pQVar3 = QScopedPointer<QGraphicsLayoutStyleInfo,_QScopedPointerDeleter<QGraphicsLayoutStyleInfo>_>
             ::operator->(&pQVar2->m_styleInfo);
    (*(pQVar3->super_QAbstractLayoutStyleInfo)._vptr_QAbstractLayoutStyleInfo[6])();
  }
  QGraphicsLayout::invalidate(in_stack_00000020);
  return;
}

Assistant:

void QGraphicsLinearLayout::invalidate()
{
    Q_D(QGraphicsLinearLayout);
    d->engine.invalidate();
    if (d->m_styleInfo)
        d->m_styleInfo->invalidate();
    QGraphicsLayout::invalidate();
}